

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_functional.h
# Opt level: O0

void __thiscall mp::PLPoints::AddPoint(PLPoints *this,double x,double y)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  long in_RDI;
  vector<double,_std::allocator<double>_> *in_XMM0_Qa;
  double in_XMM1_Qa;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd0;
  
  empty((PLPoints *)0x52b704);
  bVar1 = empty((PLPoints *)0x52b714);
  if ((bVar1) ||
     (pvVar3 = std::vector<double,_std::allocator<double>_>::back(in_stack_ffffffffffffffc0),
     *pvVar3 + 0.0001 < (double)in_XMM0_Qa)) {
    iVar2 = size((PLPoints *)0x52b754);
    if (1 < iVar2) {
      in_stack_ffffffffffffffd0 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x18);
      iVar2 = size((PLPoints *)0x52b773);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_stack_ffffffffffffffd0,(long)(iVar2 + -1));
      if (*pvVar3 == in_XMM1_Qa) {
        in_stack_ffffffffffffffc8 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x18);
        iVar2 = size((PLPoints *)0x52b7a7);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_stack_ffffffffffffffc8,(long)(iVar2 + -2));
        if ((*pvVar3 == in_XMM1_Qa) && (!NAN(*pvVar3) && !NAN(in_XMM1_Qa))) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::back(in_XMM0_Qa);
          *pvVar3 = (value_type)in_XMM0_Qa;
          return;
        }
      }
    }
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_ffffffffffffffd0,(value_type_conflict *)in_stack_ffffffffffffffc8);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_ffffffffffffffd0,(value_type_conflict *)in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void AddPoint(double x, double y) {
    if (!empty())
      assert(x > x_.back());
    if (empty() || x>x_.back()+1e-4) {  // skip near points for Gurobi
      if (size()>=2 &&                  // simple check: 3rd equal y
         y_[size()-1]==y && y_[size()-2]==y) {
        x_.back() = x;                  // update last x
      } else {
        x_.push_back(x);
        y_.push_back(y);
      }
    }
  }